

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void hotspot_cb(Fl_Light_Button *i,void *v)

{
  bool bVar1;
  Fl_Widget_Type *this;
  byte bVar2;
  uchar v_00;
  char cVar3;
  int iVar4;
  Fl_Widget_Type *local_28;
  Fl_Type *o;
  Fl_Type *p;
  void *v_local;
  Fl_Light_Button *i_local;
  
  this = current_widget;
  if ((char *)v == "LOAD") {
    if (numselected < 2) {
      iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
      if (iVar4 == 0) {
        Fl_Widget::label((Fl_Widget *)i,"hotspot");
      }
      else {
        Fl_Widget::label((Fl_Widget *)i,"divider");
      }
      Fl_Widget::activate((Fl_Widget *)i);
      bVar2 = Fl_Widget_Type::hotspot(current_widget);
      Fl_Button::value(&i->super_Fl_Button,(uint)bVar2);
    }
    else {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
  }
  else {
    v_00 = Fl_Button::value(&i->super_Fl_Button);
    Fl_Widget_Type::hotspot(this,v_00);
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar4 == 0) {
      cVar3 = Fl_Button::value(&i->super_Fl_Button);
      if (cVar3 != '\0') {
        o = (current_widget->super_Fl_Type).parent;
        if (o == (Fl_Type *)0x0) {
          return;
        }
        iVar4 = (*o->_vptr_Fl_Type[0x17])();
        if (iVar4 == 0) {
          return;
        }
        while (iVar4 = (*o->_vptr_Fl_Type[0x21])(), iVar4 == 0) {
          o = o->parent;
        }
        local_28 = (Fl_Widget_Type *)o->next;
        while( true ) {
          bVar1 = false;
          if (local_28 != (Fl_Widget_Type *)0x0) {
            bVar1 = o->level < (local_28->super_Fl_Type).level;
          }
          if (!bVar1) break;
          iVar4 = (*(local_28->super_Fl_Type)._vptr_Fl_Type[0x17])();
          if ((iVar4 != 0) && (local_28 != current_widget)) {
            Fl_Widget_Type::hotspot(local_28,'\0');
          }
          local_28 = (Fl_Widget_Type *)(local_28->super_Fl_Type).next;
        }
      }
      set_modflag(1);
    }
    else {
      Fl_Widget_Type::redraw(current_widget);
    }
  }
  return;
}

Assistant:

void hotspot_cb(Fl_Light_Button* i,void* v) {
  if (v == LOAD) {
    if (numselected > 1) {i->deactivate(); return;}
    if (current_widget->is_menu_item()) i->label("divider");
    else i->label("hotspot");
    i->activate();
    i->value(current_widget->hotspot());
  } else {
    current_widget->hotspot(i->value());
    if (current_widget->is_menu_item()) {current_widget->redraw(); return;}
    if (i->value()) {
      Fl_Type *p = current_widget->parent;
      if (!p || !p->is_widget()) return;
      while (!p->is_window()) p = p->parent;
      for (Fl_Type *o = p->next; o && o->level > p->level; o = o->next) {
	if (o->is_widget() && o != current_widget)
	  ((Fl_Widget_Type*)o)->hotspot(0);
      }
    }
    set_modflag(1);
  }
}